

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

bool __thiscall FM::OPNA::Init(OPNA *this,uint c,uint r,bool ipflag,char *path)

{
  bool bVar1;
  uint8 *puVar2;
  int local_34;
  int i;
  char *path_local;
  bool ipflag_local;
  uint r_local;
  uint c_local;
  OPNA *this_local;
  
  (this->super_OPNABase).super_OPNBase.rate = 8000;
  LoadRhythmSample(this,path);
  if ((this->super_OPNABase).adpcmbuf == (uint8 *)0x0) {
    puVar2 = (uint8 *)operator_new__(0x40000);
    (this->super_OPNABase).adpcmbuf = puVar2;
  }
  if ((this->super_OPNABase).adpcmbuf == (uint8 *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = SetRate(this,c,r,ipflag);
    if (bVar1) {
      bVar1 = OPNABase::Init(&this->super_OPNABase,c,r,ipflag);
      if (bVar1) {
        (*(this->super_OPNABase).super_OPNBase.super_Timer._vptr_Timer[3])();
        SetVolumeADPCM(this,0);
        SetVolumeRhythmTotal(this,0);
        for (local_34 = 0; local_34 < 6; local_34 = local_34 + 1) {
          SetVolumeRhythm(this,0,0);
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool OPNA::Init(uint c, uint r, bool ipflag, const char* path)
{
	rate = 8000;
	LoadRhythmSample(path);

	if (!adpcmbuf)
		adpcmbuf = new uint8[0x40000];
	if (!adpcmbuf)
		return false;

	if (!SetRate(c, r, ipflag))
		return false;
	if (!OPNABase::Init(c, r, ipflag))
		return false;

	Reset();

	SetVolumeADPCM(0);
	SetVolumeRhythmTotal(0);
	for (int i=0; i<6; i++)
		SetVolumeRhythm(0, 0);
	return true;
}